

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

string * testing::internal::FormatCompilerIndependentFileLocation_abi_cxx11_(char *file,int line)

{
  int in_EDX;
  string *in_RDI;
  string file_name;
  allocator<char> *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  string local_70 [32];
  undefined4 local_50;
  allocator<char> local_39;
  string local_38 [36];
  int local_14;
  
  local_14 = in_EDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  std::allocator<char>::~allocator(&local_39);
  if (local_14 < 0) {
    std::__cxx11::string::string((string *)in_RDI,local_38);
  }
  else {
    std::operator+(in_stack_ffffffffffffff78,(char *)in_stack_ffffffffffffff70);
    StreamableToString<int>((int *)in_stack_ffffffffffffff78);
    std::operator+(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
    std::__cxx11::string::~string(local_70);
  }
  local_50 = 1;
  std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

GTEST_API_ ::std::string FormatCompilerIndependentFileLocation(const char* file,
                                                               int line) {
  const std::string file_name(file == nullptr ? kUnknownFile : file);

  if (line < 0)
    return file_name;
  else
    return file_name + ":" + StreamableToString(line);
}